

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void s_RemoveDefineFlag(string *flag,string *dflags)

{
  ulong uVar1;
  size_type sVar2;
  int iVar3;
  ulong uVar4;
  
  sVar2 = flag->_M_string_length;
  for (uVar4 = std::__cxx11::string::find((char *)dflags,(ulong)(flag->_M_dataplus)._M_p,0);
      uVar4 != 0xffffffffffffffff;
      uVar4 = std::__cxx11::string::find((char *)dflags,(ulong)(flag->_M_dataplus)._M_p,uVar4)) {
    if (((uVar4 == 0) ||
        (iVar3 = isspace((uint)(byte)(dflags->_M_dataplus)._M_p[uVar4 - 1]), iVar3 != 0)) &&
       ((uVar1 = uVar4 + sVar2, dflags->_M_string_length <= uVar1 ||
        (iVar3 = isspace((uint)(byte)(dflags->_M_dataplus)._M_p[uVar1]), iVar3 != 0)))) {
      std::__cxx11::string::erase((ulong)dflags,uVar4);
    }
    else {
      uVar4 = uVar4 + 1;
    }
  }
  return;
}

Assistant:

static void s_RemoveDefineFlag(std::string const& flag, std::string& dflags)
{
  std::string::size_type const len = flag.length();
  // Remove all instances of the flag that are surrounded by
  // whitespace or the beginning/end of the string.
  for (std::string::size_type lpos = dflags.find(flag, 0);
       lpos != std::string::npos; lpos = dflags.find(flag, lpos)) {
    std::string::size_type rpos = lpos + len;
    if ((lpos <= 0 || cmIsSpace(dflags[lpos - 1])) &&
        (rpos >= dflags.size() || cmIsSpace(dflags[rpos]))) {
      dflags.erase(lpos, len);
    } else {
      ++lpos;
    }
  }
}